

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,Context *param_3)

{
  deUint32 *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::VkDevice_s_*> data;
  RefData<vk::VkDevice_s_*> data_00;
  RefData<vk::VkDevice_s_*> data_01;
  RefData<vk::VkDevice_s_*> data_02;
  allocator<char> local_361;
  string local_360;
  Move<vk::VkDevice_s_*> local_340;
  RefData<vk::VkDevice_s_*> local_328;
  undefined1 local_310 [8];
  Unique<vk::VkDevice_s_*> obj3;
  RefData<vk::VkDevice_s_*> local_2e0;
  undefined1 local_2c8 [8];
  Unique<vk::VkDevice_s_*> obj2;
  RefData<vk::VkDevice_s_*> local_298;
  undefined1 local_280 [8];
  Unique<vk::VkDevice_s_*> obj1;
  Move<vk::VkDevice_s_*> local_258;
  RefData<vk::VkDevice_s_*> local_240;
  undefined1 local_228 [8];
  Unique<vk::VkDevice_s_*> obj0;
  Resources res;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = &res.queueFamilyIndex;
  context_local = param_3;
  local_10 = __return_storage_ptr__;
  Environment::Environment((Environment *)this,context,4);
  this_00 = &obj0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  Device::Resources::Resources
            ((Resources *)this_00,(Environment *)this,(Parameters *)&context_local);
  Device::create(&local_258,(Environment *)this,(Resources *)this_00,(Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_240,(Move *)&local_258);
  data.deleter.m_destroyDevice = local_240.deleter.m_destroyDevice;
  data.object = local_240.object;
  data.deleter.m_allocator = local_240.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_228,data);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_258);
  Device::create((Move<vk::VkDevice_s_*> *)
                 &obj2.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Environment *)&res.queueFamilyIndex,
                 (Resources *)&obj0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_298,(Move *)&obj2.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  data_00.deleter.m_destroyDevice = local_298.deleter.m_destroyDevice;
  data_00.object = local_298.object;
  data_00.deleter.m_allocator = local_298.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_280,data_00);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
            ((Move<vk::VkDevice_s_*> *)
             &obj2.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  Device::create((Move<vk::VkDevice_s_*> *)
                 &obj3.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Environment *)&res.queueFamilyIndex,
                 (Resources *)&obj0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2e0,(Move *)&obj3.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  data_01.deleter.m_destroyDevice = local_2e0.deleter.m_destroyDevice;
  data_01.object = local_2e0.object;
  data_01.deleter.m_allocator = local_2e0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_2c8,data_01);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
            ((Move<vk::VkDevice_s_*> *)
             &obj3.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  Device::create(&local_340,(Environment *)&res.queueFamilyIndex,
                 (Resources *)&obj0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_328,(Move *)&local_340);
  data_02.deleter.m_destroyDevice = local_328.deleter.m_destroyDevice;
  data_02.object = local_328.object;
  data_02.deleter.m_allocator = local_328.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_310,data_02);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_340);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_310);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_2c8);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_280);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Ok",&local_361);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  Device::Resources::~Resources
            ((Resources *)&obj0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}